

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.hpp
# Opt level: O3

void __thiscall duckdb::ArrowScanLocalState::Reset(ArrowScanLocalState *this)

{
  pointer this_00;
  _Hash_node_base *p_Var1;
  
  this->chunk_offset = 0;
  for (p_Var1 = (this->array_states)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    this_00 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
              ::operator->((unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
                            *)(p_Var1 + 2));
    ArrowArrayScanState::Reset(this_00);
  }
  return;
}

Assistant:

void Reset() {
		chunk_offset = 0;
		for (auto &col : array_states) {
			col.second->Reset();
		}
	}